

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this,string *id,EAMParameters *data)

{
  string *in_RDX;
  GenericData *in_RSI;
  EAMParameters *in_RDI;
  EAMParameters *in_stack_ffffffffffffffc8;
  
  GenericData::GenericData(in_RSI,in_RDX);
  *(undefined ***)in_RDI = &PTR__SimpleTypeData_004e9c00;
  EAMParameters::EAMParameters(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}